

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

nh_topten_entry *
nh_get_topten(int *out_len,char *statusbuf,char *player,int top,int around,boolean own)

{
  xchar xVar1;
  uint uVar2;
  int iVar3;
  char *__s1;
  toptenentry *__dest;
  undefined1 *__ptr;
  nh_topten_entry *__s;
  int iVar4;
  long lVar5;
  char *pcVar6;
  toptenentry *ptVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  toptenentry newtt;
  toptenentry local_f0;
  
  xVar1 = dungeon_topology.d_wiz1_level.dlevel;
  bVar9 = true;
  if ((dungeon_topology.d_wiz1_level.dlevel != '\0') && (moves != 0)) {
    bVar9 = program_state.gameover == 0;
  }
  *statusbuf = '\0';
  *out_len = 0;
  iVar4 = exit_jmp_buf_valid + 1;
  bVar10 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar4;
  if ((bVar10) && (iVar4 = __sigsetjmp(exit_jmp_buf), iVar4 != 0)) {
    __s = (nh_topten_entry *)0x0;
  }
  else {
    if (xVar1 == '\0') {
      dlb_init();
      init_dungeons();
    }
    if (bVar9) {
      __s1 = "";
    }
    else {
      __s1 = plname;
    }
    if (player != (char *)0x0) {
      __s1 = player;
    }
    iVar4 = open_datafile("record",0,2);
    __dest = read_topten(iVar4,10000);
    close(iVar4);
    if (__dest == (toptenentry *)0x0) {
      builtin_strncpy(statusbuf,"Cannot open record file!",0x19);
      __s = (nh_topten_entry *)0x0;
    }
    else {
      uVar2 = 0xffffffff;
      if ((!bVar9) && (iVar4 = strcmp(__s1,plname), iVar4 == 0)) {
        fill_topten_entry(&local_f0,end_how);
        uVar2 = 0xffffffff;
        lVar5 = 0;
        ptVar7 = __dest;
        do {
          if ((ptVar7->points < 1) && (ptVar7->deathlev == 0)) break;
          iVar4 = bcmp(ptVar7,&local_f0,0xc0);
          if (iVar4 == 0) {
            uVar2 = (uint)lVar5;
          }
          lVar5 = lVar5 + 1;
          ptVar7 = ptVar7 + 1;
        } while (lVar5 != 10000);
        if (flags.explore == '\0' && flags.debug == '\0') {
          if (uVar2 < 10) {
            builtin_strncpy(statusbuf,"You made the top ten list!",0x1b);
          }
          else {
            pcVar6 = ordin(uVar2 + 1);
            sprintf(statusbuf,"You reached the %d%s place on the score list.",(ulong)(uVar2 + 1),
                    pcVar6);
          }
        }
        else {
          pcVar6 = "discover";
          if (flags.debug != '\0') {
            pcVar6 = "wizard";
          }
          sprintf(statusbuf,"Since you were in %s mode, your game was not added to the score list.",
                  pcVar6);
        }
      }
      __ptr = (undefined1 *)calloc(10000,1);
      pcVar6 = __dest->name;
      iVar4 = 0;
      lVar5 = 0;
      do {
        if ((((toptenentry *)(pcVar6 + -0x4c))->points < 1) && (*(int *)(pcVar6 + -0x44) == 0))
        break;
        if (top == -1 || lVar5 < top) {
          __ptr[lVar5] = 1;
        }
        if ((own != '\0') && (iVar3 = strcmp(__s1,pcVar6), iVar3 == 0)) {
          __ptr[lVar5] = 1;
        }
        if (((uVar2 != 0xffffffff) && ((int)(uVar2 - around) <= lVar5)) &&
           (lVar5 <= (int)(around + uVar2))) {
          __ptr[lVar5] = 1;
        }
        iVar4 = (iVar4 + 1) - (uint)(__ptr[lVar5] == '\0');
        lVar5 = lVar5 + 1;
        pcVar6 = pcVar6 + 0xc0;
      } while (lVar5 != 10000);
      bVar10 = iVar4 == 0;
      if (!bVar9 && bVar10) {
        memcpy(__dest,&local_f0,0xc0);
        *__ptr = 1;
        iVar4 = 1;
      }
      __s = (nh_topten_entry *)xmalloc((int)((long)iVar4 * 0x298));
      iVar3 = 0;
      memset(__s,0,(long)iVar4 * 0x298);
      *out_len = iVar4;
      uVar8 = 0;
      ptVar7 = __dest;
      do {
        if ((ptVar7->points < 1) && (ptVar7->deathlev == 0)) break;
        if (__ptr[uVar8] != '\0') {
          lVar5 = (long)iVar3;
          iVar3 = iVar3 + 1;
          fill_nh_score_entry(ptVar7,__s + lVar5,(int)uVar8 + 1,uVar2 == uVar8);
        }
        uVar8 = uVar8 + 1;
        ptVar7 = ptVar7 + 1;
      } while (uVar8 != 10000);
      if (!bVar9 && bVar10) {
        __s->rank = -1;
        __s->highlight = '\x01';
      }
      if (xVar1 == '\0') {
        free_dungeon();
        dlb_cleanup();
      }
      free(__ptr);
      free(__dest);
    }
    exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  }
  return __s;
}

Assistant:

struct nh_topten_entry *nh_get_topten(int *out_len, char *statusbuf,
				      const char *player, int top, int around, boolean own)
{
    struct toptenentry *ttlist, newtt;
    struct nh_topten_entry *score_list;
    boolean game_inited = (wiz1_level.dlevel != 0);
    boolean game_complete = game_inited && moves && program_state.gameover;
    int rank = -1; /* index of the completed game in the topten list */
    int fd, i, j, sel_count;
    boolean *selected, off_list = FALSE;
    
    statusbuf[0] = '\0';
    *out_len = 0;
    
    if (!api_entry_checkpoint())
	return NULL;
    
    if (!game_inited) {
	/* If nh_get_topten() isn't called after a game, we never went through
	 * initialization. */
	dlb_init();
	init_dungeons();
    }
    
    if (!player) {
	if (game_complete)
	    player = plname;
	else
	    player = "";
    }
    
    fd = open_datafile(RECORD, O_RDONLY, SCOREPREFIX);
    ttlist = read_topten(fd, TTLISTLEN);
    close(fd);
    if (!ttlist) {
	strcpy(statusbuf, "Cannot open record file!");
	api_exit();
	return NULL;
    }
    
    /* find the rank of a completed game in the score list */
    if (game_complete && !strcmp(player, plname)) {
	fill_topten_entry(&newtt, end_how);
	
	/* find this entry in the list */
	for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++)
	    if (!memcmp(&ttlist[i], &newtt, sizeof(struct toptenentry)))
		rank = i;
	
	if (wizard || discover)
	    sprintf(statusbuf, "Since you were in %s mode, your game was not "
	            "added to the score list.", wizard ? "wizard" : "discover");
	else if (rank >= 0 && rank < 10)
	    sprintf(statusbuf, "You made the top ten list!");
	else if (rank)
	    sprintf(statusbuf, "You reached the %d%s place on the score list.",
		    rank+1, ordin(rank+1));
    }
    
    /* select scores for display */
    sel_count = 0;
    selected = calloc(TTLISTLEN, sizeof(boolean));
    
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (top == -1 || i < top)
	    selected[i] = TRUE;
	
	if (own && !strcmp(player, ttlist[i].name))
	    selected[i] = TRUE;
	
	if (rank != -1 && rank - around <= i && i <= rank + around)
	    selected[i] = TRUE;
	
	if (selected[i])
	    sel_count++;
    }
    
    if (game_complete && sel_count == 0) {
	/* didn't make it onto the list and nothing else is selected */
	ttlist[0] = newtt;
	selected[0] = TRUE;
	sel_count++;
	off_list = TRUE;
    }
    
    
    score_list = xmalloc(sel_count * sizeof(struct nh_topten_entry));
    memset(score_list, 0, sel_count * sizeof(struct nh_topten_entry));
    *out_len = sel_count;
    j = 0;
    for (i = 0; i < TTLISTLEN && validentry(ttlist[i]); i++) {
	if (selected[i])
	    fill_nh_score_entry(&ttlist[i], &score_list[j++], i+1, i == rank);
    }
    
    if (off_list) {
	score_list[0].rank = -1;
	score_list[0].highlight = TRUE;
    }
    
    if (!game_inited) {
	    free_dungeon();
	    dlb_cleanup();
    }
    
    free(selected);
    free(ttlist);
    
    api_exit();
    return score_list;
}